

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O3

bool __thiscall Clasp::ClaspBerkmin::hasTopUnsat(ClaspBerkmin *this,Solver *s)

{
  uint uVar1;
  uint uVar2;
  size_type sVar3;
  size_type sVar4;
  Constraint *pCVar5;
  pointer pLVar6;
  size_type sVar7;
  size_type sVar8;
  undefined4 in_EAX;
  int iVar9;
  uint uVar10;
  uint __tmp;
  uint uVar12;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar13;
  undefined8 uVar14;
  uint32 uVar11;
  
  uVar12 = (s->learnts_).ebo_.size;
  uVar1 = this->topConflict_;
  uVar10 = uVar12;
  if (uVar1 < uVar12) {
    uVar10 = uVar1;
  }
  this->topConflict_ = uVar10;
  if (this->topOther_ < uVar12) {
    uVar12 = this->topOther_;
  }
  this->topOther_ = uVar12;
  (this->freeOtherLits_).ebo_.size = 0;
  (this->freeLits_).ebo_.size = 0;
  uVar2 = (this->types_).m;
  uVar14 = CONCAT44(uVar2,in_EAX);
  if (uVar1 < uVar12 && 1 < uVar2) {
    do {
      pCVar5 = (s->learnts_).ebo_.buf[uVar12 - 1];
      iVar9 = (*pCVar5->_vptr_Constraint[0xf])
                        (pCVar5,s,&stack0xffffffffffffffcc,&this->freeLits_,in_R8,in_R9,uVar14);
      if (iVar9 != 0) {
        pLVar6 = (this->freeLits_).ebo_.buf;
        sVar7 = (this->freeLits_).ebo_.size;
        sVar8 = (this->freeLits_).ebo_.cap;
        sVar3 = (this->freeOtherLits_).ebo_.size;
        sVar4 = (this->freeOtherLits_).ebo_.cap;
        (this->freeLits_).ebo_.buf = (this->freeOtherLits_).ebo_.buf;
        (this->freeLits_).ebo_.size = sVar3;
        (this->freeLits_).ebo_.cap = sVar4;
        (this->freeOtherLits_).ebo_.buf = pLVar6;
        (this->freeOtherLits_).ebo_.size = sVar7;
        (this->freeOtherLits_).ebo_.cap = sVar8;
        uVar10 = this->topConflict_;
        break;
      }
      uVar10 = this->topConflict_;
      uVar12 = this->topOther_ - 1;
      this->topOther_ = uVar12;
      (this->freeLits_).ebo_.size = 0;
    } while (uVar10 < uVar12);
  }
  uVar12 = uVar10 - this->maxBerkmin_;
  if (uVar10 < this->maxBerkmin_) {
    uVar12 = 0;
  }
  if (uVar10 != uVar12) {
    do {
      pCVar5 = (s->learnts_).ebo_.buf[uVar10 - 1];
      iVar9 = (*pCVar5->_vptr_Constraint[0xf])(pCVar5,s,&stack0xffffffffffffffcc,&this->freeLits_);
      if (iVar9 == 0) {
        uVar11 = this->topConflict_;
      }
      else {
        if (iVar9 == 1) break;
        uVar11 = this->topConflict_;
        this->topOther_ = uVar11;
        pLVar6 = (this->freeLits_).ebo_.buf;
        sVar4 = (this->freeLits_).ebo_.size;
        sVar7 = (this->freeLits_).ebo_.cap;
        (this->freeLits_).ebo_.buf = (this->freeOtherLits_).ebo_.buf;
        sVar3 = (this->freeOtherLits_).ebo_.cap;
        (this->freeOtherLits_).ebo_.buf = pLVar6;
        (this->freeOtherLits_).ebo_.size = sVar4;
        (this->freeOtherLits_).ebo_.cap = sVar7;
        (this->freeLits_).ebo_.cap = sVar3;
      }
      uVar10 = uVar11 - 1;
      this->topConflict_ = uVar10;
      (this->freeLits_).ebo_.size = 0;
    } while (uVar10 != uVar12);
  }
  sVar3 = (this->freeOtherLits_).ebo_.size;
  if (sVar3 == 0) {
    this->topOther_ = this->topConflict_;
  }
  bVar13 = (this->freeLits_).ebo_.size != 0;
  if (!bVar13) {
    pLVar6 = (this->freeOtherLits_).ebo_.buf;
    (this->freeOtherLits_).ebo_.buf = (this->freeLits_).ebo_.buf;
    (this->freeLits_).ebo_.buf = pLVar6;
    (this->freeOtherLits_).ebo_.size = 0;
    (this->freeLits_).ebo_.size = sVar3;
    sVar4 = (this->freeOtherLits_).ebo_.cap;
    (this->freeOtherLits_).ebo_.cap = (this->freeLits_).ebo_.cap;
    (this->freeLits_).ebo_.cap = sVar4;
  }
  return bVar13 || sVar3 != 0;
}

Assistant:

bool ClaspBerkmin::hasTopUnsat(Solver& s) {
	topConflict_  = std::min(s.numLearntConstraints(), topConflict_);
	topOther_     = std::min(s.numLearntConstraints(), topOther_);
	assert(topConflict_ <= topOther_);
	freeOtherLits_.clear();
	freeLits_.clear();
	TypeSet ts = types_;
	if (ts.m > 1) {
		while (topOther_ > topConflict_) {
			if (s.getLearnt(topOther_-1).isOpen(s, ts, freeLits_) != 0) {
				freeLits_.swap(freeOtherLits_);
				ts.m = 0;
				break;
			}
			--topOther_;
			freeLits_.clear();
		}
	}
	ts.addSet(Constraint_t::Conflict);
	uint32 stopAt = topConflict_ < maxBerkmin_ ? 0 : topConflict_ - maxBerkmin_;
	while (topConflict_ != stopAt) {
		uint32 x = s.getLearnt(topConflict_-1).isOpen(s, ts, freeLits_);
		if (x != 0) {
			if (x == Constraint_t::Conflict) { break; }
			topOther_  = topConflict_;
			freeLits_.swap(freeOtherLits_);
			ts.m = 0;
			ts.addSet(Constraint_t::Conflict);
		}
		--topConflict_;
		freeLits_.clear();
	}
	if (freeOtherLits_.empty())  topOther_ = topConflict_;
	if (freeLits_.empty())      freeOtherLits_.swap(freeLits_);
	return !freeLits_.empty();
}